

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_case.cc
# Opt level: O1

void __thiscall CaseType::GenPrivDecls(CaseType *this,Output *out_h,Env *env)

{
  long *plVar1;
  ExternType *pEVar2;
  char *pcVar3;
  long *local_40 [2];
  long local_30 [2];
  
  pEVar2 = (ExternType *)Expr::DataType(this->index_expr_,env);
  if ((pEVar2->super_Type).tot_ != BUILTIN) {
    pEVar2 = extern_type_int;
  }
  (*(pEVar2->super_Type).super_DataDepElement._vptr_DataDepElement[0xb])(local_40,pEVar2);
  plVar1 = local_40[0];
  pcVar3 = Env::LValue(env,this->index_var_);
  Output::println(out_h,"%s %s;",plVar1,pcVar3);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  Type::GenPrivDecls(&this->super_Type,out_h,env);
  return;
}

Assistant:

void CaseType::GenPrivDecls(Output* out_h, Env* env)
	{
	Type* t = index_expr_->DataType(env);

	if ( t->tot() != Type::BUILTIN )
		// It's a Type::EXTERN with a C++ type of "int", "bool", or "enum",
		// any of which will convert consistently using an int as storage type.
		t = extern_type_int;

	out_h->println("%s %s;", t->DataTypeStr().c_str(), env->LValue(index_var_));
	Type::GenPrivDecls(out_h, env);
	}